

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O3

void format::load_mtx_csc_real(string *filename,CSC **A)

{
  pointer pcVar1;
  read_file_error *this;
  char cVar2;
  ifstream fin;
  string local_3b8 [6];
  string local_2f8 [6];
  ifstream local_238 [520];
  
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    read_mtx_csc_real(local_238,A,false);
    std::ifstream::close();
    std::ifstream::~ifstream(local_238);
    return;
  }
  std::ifstream::close();
  this = (read_file_error *)__cxa_allocate_exception(0x30);
  local_3b8[0]._M_dataplus._M_p = (pointer)&local_3b8[0].field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b8,pcVar1,pcVar1 + filename->_M_string_length);
  local_2f8[0]._M_dataplus._M_p = (pointer)&local_2f8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"Failed to read file","");
  read_file_error::read_file_error(this,local_3b8,local_2f8);
  __cxa_throw(this,&read_file_error::typeinfo,open_file_error::~open_file_error);
}

Assistant:

void load_mtx_csc_real(std::string &filename, CSC *&A) {
  std::ifstream fin(filename);
  if(fin.is_open()){
   try {
    read_mtx_csc_real(fin, A);
   } catch (const mtx_format_error& e) {
    throw mtx_format_error(e.expected_format(),
                           e.got_format(),
                           filename,
                           e.what());
   } catch (const mtx_arith_error& e) {
    throw mtx_arith_error(e.expected_arith(),
                          e.got_arith(),
                          filename,
                          e.what());
   } catch (const mtx_header_error& e) {
    throw mtx_header_error(filename, e.what());
   }
  } else {
   fin.close();
   throw read_file_error(filename);
  }
  fin.close();
 }